

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall
CRegexParser::build_closure
          (CRegexParser *this,re_machine *new_machine,re_machine *sub,wchar_t specifier,int shortest
          )

{
  int in_ECX;
  re_state_id *in_RDX;
  re_state_id *in_RSI;
  CRegexParser *in_RDI;
  int in_R8D;
  
  init_machine((CRegexParser *)CONCAT44(in_ECX,in_R8D),(re_machine *)in_RDI);
  if (in_R8D == 0) {
    set_trans(in_RDI,*in_RSI,*in_RDX,RE_EPSILON,L'\0');
  }
  else {
    set_trans(in_RDI,in_RDX[1],in_RSI[1],RE_EPSILON,L'\0');
  }
  if ((in_ECX != 0x3f) && (set_trans(in_RDI,in_RDX[1],*in_RDX,RE_EPSILON,L'\0'), in_R8D != 0)) {
    in_RDI->tuple_arr_[in_RDX[1]].flags = in_RDI->tuple_arr_[in_RDX[1]].flags | 0x10;
  }
  if ((in_ECX != 0x2b) && (set_trans(in_RDI,*in_RSI,in_RSI[1],RE_EPSILON,L'\0'), in_R8D != 0)) {
    in_RDI->tuple_arr_[*in_RSI].flags = in_RDI->tuple_arr_[*in_RSI].flags | 0x10;
  }
  if (in_R8D == 0) {
    set_trans(in_RDI,in_RDX[1],in_RSI[1],RE_EPSILON,L'\0');
  }
  else {
    set_trans(in_RDI,*in_RSI,*in_RDX,RE_EPSILON,L'\0');
  }
  return;
}

Assistant:

void CRegexParser::build_closure(re_machine *new_machine, re_machine *sub,
                                 wchar_t specifier, int shortest)
{
    /* initialize the new machine */
    init_machine(new_machine);

    /* 
     *   Set up an epsilon transition from our initial state to the
     *   submachine's initial state.  However, if we're in shortest mode,
     *   wait to do this until after we've generated the rest of the
     *   machine, and instead set up the transition from the submachine's
     *   final state to our final state.  The order is important because
     *   we will favor the first branch taken when we find two matches of
     *   equal total length; hence we want to make the branch that will
     *   give us either the longest match or shortest match for this
     *   closure first, depending on which way we want to go.  
     */
    if (!shortest)
        set_trans(new_machine->init, sub->init, RE_EPSILON, 0);
    else
        set_trans(sub->final, new_machine->final, RE_EPSILON, 0);

    /*
     *   If this is an unbounded closure ('*' or '+', but not '?'), set up
     *   the loop transition that takes us from the new machine's final
     *   state back to its initial state.  We don't do this on the
     *   zero-or-one closure, because we can only match the expression
     *   once.  
     */
    if (specifier != '?')
    {
        /* set the transition */
        set_trans(sub->final, sub->init, RE_EPSILON, 0);

        /* if we have a 'shortest' modifier, flag it in this branch */
        if (shortest)
            tuple_arr_[sub->final].flags |= RE_STATE_SHORTEST;
    }

    /*
     *   If this is a zero-or-one closure or a zero-or-more closure, set
     *   up an epsilon transition from our initial state to our final
     *   state, since we can skip the entire subexpression.  We don't do
     *   this on the one-or-more closure, because we can't skip the
     *   subexpression in this case.  
     */
    if (specifier != '+')
    {
        /* set the transition */
        set_trans(new_machine->init, new_machine->final, RE_EPSILON, 0);

        /* if we have a 'shortest' modifier, flag it in this branch */
        if (shortest)
            tuple_arr_[new_machine->init].flags |= RE_STATE_SHORTEST;
    }

    /* 
     *   Set up a transition from the submachine's final state to our
     *   final state.  We waited until here to ensure proper ordering for
     *   longest-preferred.  If we're in shortest-preferred mode, though,
     *   set up the initial transition to the submachine instead.  
     */
    if (!shortest)
        set_trans(sub->final, new_machine->final, RE_EPSILON, 0);
    else
        set_trans(new_machine->init, sub->init, RE_EPSILON, 0);
}